

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

bool std::__equal<false>::
     equal<QList<QItemSelectionRange>::const_iterator,QList<QItemSelectionRange>::const_iterator>
               (const_iterator __first1,const_iterator __last1,const_iterator __first2)

{
  char cVar1;
  QItemSelectionRange *pQVar2;
  QItemSelectionRange *pQVar3;
  bool bVar4;
  
  bVar4 = __first1.i == __last1.i;
  if ((!bVar4) && (cVar1 = comparesEqual(&(__first1.i)->tl,&(__first2.i)->tl), cVar1 != '\0')) {
    pQVar2 = __first1.i + 1;
    pQVar3 = __first2.i + 1;
    do {
      cVar1 = comparesEqual(&pQVar2[-1].br,&pQVar3[-1].br);
      if (cVar1 == '\0') {
        return bVar4;
      }
      bVar4 = pQVar2 == __last1.i;
      if (bVar4) {
        return bVar4;
      }
      cVar1 = comparesEqual(&pQVar2->tl,&pQVar3->tl);
      pQVar2 = pQVar2 + 1;
      pQVar3 = pQVar3 + 1;
    } while (cVar1 != '\0');
  }
  return bVar4;
}

Assistant:

inline constexpr bool operator!=(const_iterator o) const { return i != o.i; }